

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O2

TermList __thiscall
Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>::denormalize
          (MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *this,TermList *results)

{
  MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar1;
  uint uVar2;
  long lVar4;
  TermList tail;
  ulong uVar5;
  anon_class_1_0_00000001 prependPowerTerm;
  int iVar3;
  
  pMVar1 = (this->_factors)._stack;
  lVar4 = (long)(this->_factors)._cursor - (long)pMVar1;
  if (lVar4 == 0) {
    tail._content = (uint64_t)NumTraits<Kernel::RealConstantType>::oneT();
  }
  else {
    iVar3 = (int)(lVar4 / 0x1c);
    uVar2 = iVar3 - 1;
    tail = denormalize::anon_class_1_0_00000001::operator()
                     (&prependPowerTerm,results[uVar2]._content,pMVar1[uVar2].power + -1,
                      results[uVar2]._content);
    uVar2 = iVar3 - 2;
    for (uVar5 = 1; pMVar1 = (this->_factors)._stack,
        uVar5 < (((long)(this->_factors)._cursor - (long)pMVar1) / 0x1c & 0xffffffffU);
        uVar5 = uVar5 + 1) {
      tail = denormalize::anon_class_1_0_00000001::operator()
                       (&prependPowerTerm,results[uVar2]._content,pMVar1[uVar2].power,tail);
      uVar2 = uVar2 - 1;
    }
  }
  return (TermList)tail._content;
}

Assistant:

TermList MonomFactors<Number>::denormalize(TermList* results)  const
{
  if (_factors.size() == 0) {
    return Number::one();
  } else {

    auto prependPowerTerm = [](TermList t, int pow, TermList tail) -> TermList {
      TermList out = tail;
      for (int i = 0; i < pow; i++) {
        out = Number::mul(t,out);
      }
      return out;
    };

    auto end = nFactors() - 1;
    ASS(_factors[end].power > 0)
    TermList out = prependPowerTerm(results[end], _factors[end].power - 1, results[end]);

    for (unsigned i = 1; i < nFactors(); i++) {
      out = prependPowerTerm(results[end - i], _factors[end - i].power, out);
    }

    return out;
  }
}